

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O2

void __thiscall QPDFCrypto_openssl::RC4_init(QPDFCrypto_openssl *this,uchar *key_data,int key_len)

{
  int iVar1;
  size_t in_RAX;
  long *plVar2;
  long lVar3;
  runtime_error *this_00;
  size_t local_28;
  
  local_28 = in_RAX;
  if (RC4_init(unsigned_char_const*,int)::rc4 == '\0') {
    iVar1 = __cxa_guard_acquire(&RC4_init(unsigned_char_const*,int)::rc4);
    if (iVar1 != 0) {
      if ((anonymous_namespace)::RC4Loader::getRC4()::loader == '\0') {
        iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::RC4Loader::getRC4()::loader);
        if (iVar1 != 0) {
          plVar2 = (long *)operator_new(0x18);
          lVar3 = OSSL_LIB_CTX_new();
          plVar2[1] = lVar3;
          if (lVar3 == 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"unable to create openssl library context");
LAB_0020b0fd:
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar3 = OSSL_PROVIDER_load(lVar3,"legacy");
          *plVar2 = lVar3;
          if (lVar3 == 0) {
            OSSL_LIB_CTX_free(plVar2[1]);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"unable to load openssl legacy provider");
            goto LAB_0020b0fd;
          }
          lVar3 = EVP_CIPHER_fetch(plVar2[1],"RC4",0);
          plVar2[2] = lVar3;
          if (lVar3 == 0) {
            OSSL_PROVIDER_unload(*plVar2);
            OSSL_LIB_CTX_free(plVar2[1]);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"unable to load openssl rc4 algorithm");
            goto LAB_0020b0fd;
          }
          _DAT_002b3700 = (undefined8 *)0x0;
          (anonymous_namespace)::RC4Loader::getRC4()::loader = plVar2;
          _DAT_002b3700 = (undefined8 *)operator_new(0x18);
          _DAT_002b3700[1] = 0x100000001;
          *_DAT_002b3700 = &PTR___Sp_counted_base_002b1c60;
          _DAT_002b3700[2] = plVar2;
          __cxa_atexit(std::
                       __shared_ptr<(anonymous_namespace)::RC4Loader,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&(anonymous_namespace)::RC4Loader::getRC4()::loader,
                       &__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::RC4Loader::getRC4()::loader);
        }
      }
      RC4_init::rc4 = (EVP_CIPHER *)(anonymous_namespace)::RC4Loader::getRC4()::loader[2];
      __cxa_guard_release(&RC4_init(unsigned_char_const*,int)::rc4);
    }
  }
  iVar1 = EVP_CIPHER_CTX_reset(this->cipher_ctx);
  check_openssl(iVar1);
  if (key_len == -1) {
    local_28 = strlen((char *)key_data);
    key_len = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_28);
  }
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)this->cipher_ctx,(EVP_CIPHER *)RC4_init::rc4,
                             (ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
  check_openssl(iVar1);
  iVar1 = EVP_CIPHER_CTX_set_key_length((EVP_CIPHER_CTX *)this->cipher_ctx,key_len);
  check_openssl(iVar1);
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)this->cipher_ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             key_data,(uchar *)0x0);
  check_openssl(iVar1);
  return;
}

Assistant:

void
QPDFCrypto_openssl::RC4_init(unsigned char const* key_data, int key_len)
{
#ifdef QPDF_OPENSSL_1
    static auto const rc4 = EVP_rc4();
#else
    static auto const rc4 = RC4Loader::getRC4();
#endif
    check_openssl(EVP_CIPHER_CTX_reset(cipher_ctx));
    if (key_len == -1) {
        key_len = QIntC::to_int(strlen(reinterpret_cast<const char*>(key_data)));
    }
    check_openssl(EVP_EncryptInit_ex(cipher_ctx, rc4, nullptr, nullptr, nullptr));
    check_openssl(EVP_CIPHER_CTX_set_key_length(cipher_ctx, key_len));
    check_openssl(EVP_EncryptInit_ex(cipher_ctx, nullptr, nullptr, key_data, nullptr));
}